

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

bool __thiscall duckdb::Linenoise::EditMoveRowDown(Linenoise *this)

{
  bool bVar1;
  size_t sVar2;
  long in_RDI;
  int cursor_col;
  int cursor_row;
  int cols;
  int rows;
  Linenoise *this_00;
  int *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Linenoise *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  Linenoise *in_stack_ffffffffffffff80;
  allocator local_41;
  string local_40;
  int local_1c;
  int local_14;
  undefined1 local_1;
  
  bVar1 = Terminal::IsMultiline();
  if (bVar1) {
    PositionToColAndRow(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        (int *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->ifd,
                        (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    if (local_1c < local_14) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_40,"source pos %d",&local_41);
      Log<unsigned_long>(&local_40,*(unsigned_long *)(in_RDI + 0x28));
      ::std::__cxx11::string::~string((string *)&local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
      this_00 = (Linenoise *)&stack0xffffffffffffff87;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff88,"move from row %d to row %d",
                 (allocator *)this_00);
      Log<int,int>((string *)&stack0xffffffffffffff88,local_1c,local_1c + 1);
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      local_1c = local_1c + 1;
      sVar2 = ColAndRowToPosition(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                                  in_stack_ffffffffffffff60);
      *(size_t *)(in_RDI + 0x28) = sVar2;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff60,"new pos %d",
                 (allocator *)&stack0xffffffffffffff5f);
      Log<unsigned_long>((string *)&stack0xffffffffffffff60,*(unsigned_long *)(in_RDI + 0x28));
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
      RefreshLine(this_00);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return (bool)local_1;
}

Assistant:

bool Linenoise::EditMoveRowDown() {
	if (!Terminal::IsMultiline()) {
		return false;
	}
	int rows, cols;
	int cursor_row, cursor_col;
	PositionToColAndRow(pos, cursor_row, cursor_col, rows, cols);
	if (cursor_row >= rows) {
		return false;
	}
	// we can move the cursor a line down
	Linenoise::Log("source pos %d", pos);
	Linenoise::Log("move from row %d to row %d", cursor_row, cursor_row + 1);
	cursor_row++;
	pos = ColAndRowToPosition(cursor_row, cursor_col);
	Linenoise::Log("new pos %d", pos);
	RefreshLine();
	return true;
}